

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslsocket.cpp
# Opt level: O1

void __thiscall QSslSocketPrivate::~QSslSocketPrivate(QSslSocketPrivate *this)

{
  TlsCryptograph *pTVar1;
  Data *pDVar2;
  
  *(undefined ***)&(this->super_QTcpSocketPrivate).super_QAbstractSocketPrivate =
       &PTR__QSslSocketPrivate_002d5de8;
  (this->super_QTcpSocketPrivate).super_QAbstractSocketPrivate.super_QAbstractSocketEngineReceiver.
  _vptr_QAbstractSocketEngineReceiver = (_func_int **)&PTR__QSslSocketPrivate_002d5e88;
  pTVar1 = (this->backend)._M_t.
           super___uniq_ptr_impl<QTlsPrivate::TlsCryptograph,_std::default_delete<QTlsPrivate::TlsCryptograph>_>
           ._M_t.
           super__Tuple_impl<0UL,_QTlsPrivate::TlsCryptograph_*,_std::default_delete<QTlsPrivate::TlsCryptograph>_>
           .super__Head_base<0UL,_QTlsPrivate::TlsCryptograph_*,_false>._M_head_impl;
  if (pTVar1 != (TlsCryptograph *)0x0) {
    (**(code **)(*(long *)pTVar1 + 0x20))();
  }
  (this->backend)._M_t.
  super___uniq_ptr_impl<QTlsPrivate::TlsCryptograph,_std::default_delete<QTlsPrivate::TlsCryptograph>_>
  ._M_t.
  super__Tuple_impl<0UL,_QTlsPrivate::TlsCryptograph_*,_std::default_delete<QTlsPrivate::TlsCryptograph>_>
  .super__Head_base<0UL,_QTlsPrivate::TlsCryptograph_*,_false>._M_head_impl = (TlsCryptograph *)0x0;
  pDVar2 = (this->verificationPeerName).d.d;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->verificationPeerName).d.d)->super_QArrayData,2,0x10);
    }
  }
  QSslConfigurationPrivate::~QSslConfigurationPrivate(&this->configuration);
  QArrayDataPointer<QSslError>::~QArrayDataPointer(&(this->ignoreErrorsList).d);
  QAbstractSocketPrivate::~QAbstractSocketPrivate((QAbstractSocketPrivate *)this);
  return;
}

Assistant:

QSslSocketPrivate::~QSslSocketPrivate()
{
}